

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void P_SpawnScrollers(void)

{
  line_t_conflict *plVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  DScroller *pDVar6;
  sector_t_conflict *in_RSI;
  double dVar7;
  double dy_00;
  EScrollPos local_234;
  EScrollPos local_214;
  EScrollPos local_1f4;
  EScrollPos local_1d4;
  EScrollPos local_1b4;
  FLineIdIterator local_d8;
  FLineIdIterator itr_3;
  line_t_conflict *line_2;
  uint j_2;
  FSectorTagIterator itr_2;
  line_t_conflict *line_1;
  uint j_1;
  FSectorTagIterator itr_1;
  line_t_conflict *line;
  uint j;
  FSectorTagIterator itr;
  double local_80;
  undefined1 local_78 [24];
  uint arg;
  int max;
  FLineSpecial *spec;
  int local_50;
  int special;
  int accel;
  int control;
  double dy;
  double dx;
  undefined1 local_28 [8];
  TArray<int,_int> copyscrollers;
  line_t_conflict *l;
  int i;
  
  copyscrollers._8_8_ = lines;
  TArray<int,_int>::TArray((TArray<int,_int> *)local_28);
  for (l._4_4_ = 0; (int)l._4_4_ < numlines; l._4_4_ = l._4_4_ + 1) {
    if (lines[(int)l._4_4_].special == 0x3a) {
      in_RSI = lines[(int)l._4_4_].frontsector;
      bVar2 = FTagManager::SectorHasTag(&tagManager,(sector_t *)in_RSI,lines[(int)l._4_4_].args[0]);
      if (!bVar2) {
        in_RSI = (sector_t_conflict *)((long)&l + 4);
        TArray<int,_int>::Push((TArray<int,_int> *)local_28,(int *)in_RSI);
      }
      lines[(int)l._4_4_].special = 0;
    }
  }
  for (l._4_4_ = 0; (int)l._4_4_ < numlines; l._4_4_ = l._4_4_ + 1) {
    special = -1;
    local_50 = 0;
    spec._4_4_ = *(uint *)(copyscrollers._8_8_ + 0x28);
    _arg = P_GetLineSpecialInfo(spec._4_4_);
    if (_arg != (FLineSpecial *)0x0) {
      local_78._16_4_ = ZEXT14(_arg->map_args);
      local_78._20_4_ = local_78._16_4_;
      for (; (uint)local_78._16_4_ < 5; local_78._16_4_ = local_78._16_4_ + 1) {
        if (*(int *)(copyscrollers._8_8_ + 0x2c + (ulong)(uint)local_78._16_4_ * 4) != 0) {
          in_RSI = (sector_t_conflict *)(ulong)l._4_4_;
          Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",in_RSI,(ulong)spec._4_4_,
                 _arg->name,(ulong)(local_78._16_4_ + 1),
                 (ulong)*(uint *)(copyscrollers._8_8_ + 0x2c + (ulong)(uint)local_78._16_4_ * 4));
        }
      }
    }
    *(undefined4 *)(copyscrollers._8_8_ + 0x28) = 0;
    _accel = 0.0;
    dy = 0.0;
    if (((spec._4_4_ == 0xe0) || (spec._4_4_ == 0xdf)) || (spec._4_4_ == 0xde)) {
      if (((*(uint *)(copyscrollers._8_8_ + 0x30) & 3) != 0) &&
         (special = (int)((**(long **)(copyscrollers._8_8_ + 0x48) - (long)sectors) / 0x218),
         (*(uint *)(copyscrollers._8_8_ + 0x30) & 2) != 0)) {
        local_50 = 1;
      }
      if ((spec._4_4_ == 0xde) || ((*(uint *)(copyscrollers._8_8_ + 0x30) & 4) != 0)) {
        line_t::Delta((line_t *)local_78);
        dy = (double)local_78._0_8_ * 0.03125;
        in_RSI = (sector_t_conflict *)copyscrollers._8_8_;
        line_t::Delta((line_t *)&itr.start);
        _accel = local_80 / 32.0;
      }
      else {
        dy = (double)(*(int *)(copyscrollers._8_8_ + 0x38) + -0x80) / 32.0;
        _accel = (double)(*(int *)(copyscrollers._8_8_ + 0x3c) + -0x80) / 32.0;
      }
    }
    if (spec._4_4_ == 100) {
      *(undefined4 *)(copyscrollers._8_8_ + 0x28) = 100;
      itr.searchtag =
           (int)((ulong)((long)lines[(int)l._4_4_].sidedef[0] - (long)sides) >> 6) * -0x55555555;
      pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
      if ((*(int *)(copyscrollers._8_8_ + 0x30) < 1) ||
         ((*(uint *)(copyscrollers._8_8_ + 0x30) & 0xfffffff8) != 0)) {
        local_1d4 = scw_all;
      }
      else {
        local_1d4 = *(EScrollPos *)(copyscrollers._8_8_ + 0x30);
      }
      in_RSI = (sector_t_conflict *)0x0;
      DScroller::DScroller
                (pDVar6,sc_side,(double)*(int *)(copyscrollers._8_8_ + 0x2c) / 64.0,0.0,-1,
                 itr.searchtag,local_50,local_1d4);
    }
    else if (spec._4_4_ == 0x65) {
      *(undefined4 *)(copyscrollers._8_8_ + 0x28) = 0x65;
      itr.searchtag =
           (int)((ulong)((long)lines[(int)l._4_4_].sidedef[0] - (long)sides) >> 6) * -0x55555555;
      pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
      if ((*(int *)(copyscrollers._8_8_ + 0x30) < 1) ||
         ((*(uint *)(copyscrollers._8_8_ + 0x30) & 0xfffffff8) != 0)) {
        local_1f4 = scw_all;
      }
      else {
        local_1f4 = *(EScrollPos *)(copyscrollers._8_8_ + 0x30);
      }
      in_RSI = (sector_t_conflict *)0x0;
      DScroller::DScroller
                (pDVar6,sc_side,(double)-*(int *)(copyscrollers._8_8_ + 0x2c) / 64.0,0.0,-1,
                 itr.searchtag,local_50,local_1f4);
    }
    else if (spec._4_4_ == 0x66) {
      *(undefined4 *)(copyscrollers._8_8_ + 0x28) = 0x66;
      itr.searchtag =
           (int)((ulong)((long)lines[(int)l._4_4_].sidedef[0] - (long)sides) >> 6) * -0x55555555;
      pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
      if ((*(int *)(copyscrollers._8_8_ + 0x30) < 1) ||
         ((*(uint *)(copyscrollers._8_8_ + 0x30) & 0xfffffff8) != 0)) {
        local_214 = scw_all;
      }
      else {
        local_214 = *(EScrollPos *)(copyscrollers._8_8_ + 0x30);
      }
      in_RSI = (sector_t_conflict *)0x0;
      DScroller::DScroller
                (pDVar6,sc_side,0.0,(double)*(int *)(copyscrollers._8_8_ + 0x2c) / 64.0,-1,
                 itr.searchtag,local_50,local_214);
    }
    else if (spec._4_4_ == 0x67) {
      *(undefined4 *)(copyscrollers._8_8_ + 0x28) = 0x67;
      itr.searchtag =
           (int)((ulong)((long)lines[(int)l._4_4_].sidedef[0] - (long)sides) >> 6) * -0x55555555;
      pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
      if ((*(int *)(copyscrollers._8_8_ + 0x30) < 1) ||
         ((*(uint *)(copyscrollers._8_8_ + 0x30) & 0xfffffff8) != 0)) {
        local_234 = scw_all;
      }
      else {
        local_234 = *(EScrollPos *)(copyscrollers._8_8_ + 0x30);
      }
      in_RSI = (sector_t_conflict *)0x0;
      DScroller::DScroller
                (pDVar6,sc_side,0.0,(double)-*(int *)(copyscrollers._8_8_ + 0x2c) / 64.0,-1,
                 itr.searchtag,local_50,local_234);
    }
    else if (spec._4_4_ == 0xdd) {
      itr.searchtag = (int)(((long)lines[(int)l._4_4_].sidedef[0] - (long)sides) / 0xc0);
      if (*(int *)(copyscrollers._8_8_ + 0x2c) == 0) {
        dy = (double)(*(int *)(copyscrollers._8_8_ + 0x30) - *(int *)(copyscrollers._8_8_ + 0x34)) *
             0.015625;
        _accel = (double)(*(int *)(copyscrollers._8_8_ + 0x3c) -
                         *(int *)(copyscrollers._8_8_ + 0x38)) * 0.015625;
        pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
        in_RSI = (sector_t_conflict *)0x0;
        DScroller::DScroller(pDVar6,sc_side,dy,_accel,-1,itr.searchtag,local_50,scw_all);
      }
    }
    else if (spec._4_4_ == 0xde) {
      in_RSI = (sector_t_conflict *)(ulong)*(uint *)(copyscrollers._8_8_ + 0x2c);
      FLineIdIterator::FLineIdIterator(&local_d8,*(uint *)(copyscrollers._8_8_ + 0x2c));
      while (itr.searchtag = FLineIdIterator::Next(&local_d8), -1 < itr.searchtag) {
        if (itr.searchtag != l._4_4_) {
          pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
          in_RSI = (sector_t_conflict *)(lines + itr.searchtag);
          DScroller::DScroller(pDVar6,dy,_accel,(line_t_conflict *)in_RSI,special,local_50,scw_all);
        }
      }
    }
    else if (spec._4_4_ == 0xdf) {
      if (*(int *)(copyscrollers._8_8_ + 0x34) != 1) {
        in_RSI = (sector_t_conflict *)(ulong)*(uint *)(copyscrollers._8_8_ + 0x2c);
        FSectorTagIterator::FSectorTagIterator
                  ((FSectorTagIterator *)&stack0xffffffffffffff58,
                   *(uint *)(copyscrollers._8_8_ + 0x2c));
        while (itr.searchtag =
                    FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffff58),
              -1 < itr.searchtag) {
          pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
          in_RSI = (sector_t_conflict *)0x1;
          DScroller::DScroller(pDVar6,sc_floor,-dy,_accel,special,itr.searchtag,local_50,scw_all);
        }
        for (line_1._4_4_ = 0; uVar4 = TArray<int,_int>::Size((TArray<int,_int> *)local_28),
            plVar1 = lines, line_1._4_4_ < uVar4; line_1._4_4_ = line_1._4_4_ + 1) {
          in_RSI = (sector_t_conflict *)(ulong)line_1._4_4_;
          piVar5 = TArray<int,_int>::operator[]((TArray<int,_int> *)local_28,(size_t)in_RSI);
          itr_2 = (FSectorTagIterator)(plVar1 + *piVar5);
          if ((*(int *)((long)itr_2 + 0x2c) == *(int *)(copyscrollers._8_8_ + 0x2c)) &&
             ((*(int *)((long)itr_2 + 0x30) & 2U) != 0)) {
            pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
            in_RSI = (sector_t_conflict *)0x1;
            DScroller::DScroller
                      (pDVar6,sc_floor,-dy,_accel,special,
                       (int)((ulong)(*(long *)((long)itr_2 + 0x78) - (long)sectors) >> 3) *
                       0x7a44c6b,local_50,scw_all);
          }
        }
      }
      if (0 < *(int *)(copyscrollers._8_8_ + 0x34)) {
        in_RSI = (sector_t_conflict *)(ulong)*(uint *)(copyscrollers._8_8_ + 0x2c);
        FSectorTagIterator::FSectorTagIterator
                  ((FSectorTagIterator *)&stack0xffffffffffffff40,
                   *(uint *)(copyscrollers._8_8_ + 0x2c));
        while (itr.searchtag =
                    FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffff40),
              -1 < itr.searchtag) {
          pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
          in_RSI = (sector_t_conflict *)0x3;
          DScroller::DScroller(pDVar6,sc_carry,dy,_accel,special,itr.searchtag,local_50,scw_all);
        }
        for (line_2._4_4_ = 0; uVar4 = TArray<int,_int>::Size((TArray<int,_int> *)local_28),
            plVar1 = lines, line_2._4_4_ < uVar4; line_2._4_4_ = line_2._4_4_ + 1) {
          in_RSI = (sector_t_conflict *)(ulong)line_2._4_4_;
          piVar5 = TArray<int,_int>::operator[]((TArray<int,_int> *)local_28,(size_t)in_RSI);
          itr_3 = (FLineIdIterator)(plVar1 + *piVar5);
          if ((*(int *)((long)itr_3 + 0x2c) == *(int *)(copyscrollers._8_8_ + 0x2c)) &&
             ((*(int *)((long)itr_3 + 0x30) & 4U) != 0)) {
            pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
            in_RSI = (sector_t_conflict *)0x3;
            DScroller::DScroller
                      (pDVar6,sc_carry,dy,_accel,special,
                       (int)((ulong)(*(long *)((long)itr_3 + 0x78) - (long)sectors) >> 3) *
                       0x7a44c6b,local_50,scw_all);
          }
        }
      }
    }
    else if (spec._4_4_ == 0xe0) {
      in_RSI = (sector_t_conflict *)(ulong)*(uint *)(copyscrollers._8_8_ + 0x2c);
      FSectorTagIterator::FSectorTagIterator
                ((FSectorTagIterator *)((long)&line + 4),*(uint *)(copyscrollers._8_8_ + 0x2c));
      while (itr.searchtag = FSectorTagIterator::Next((FSectorTagIterator *)((long)&line + 4)),
            -1 < itr.searchtag) {
        pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
        in_RSI = (sector_t_conflict *)0x2;
        DScroller::DScroller(pDVar6,sc_ceiling,-dy,_accel,special,itr.searchtag,local_50,scw_all);
      }
      for (line._0_4_ = 0; uVar4 = (uint)line,
          uVar3 = TArray<int,_int>::Size((TArray<int,_int> *)local_28), plVar1 = lines,
          uVar4 < uVar3; line._0_4_ = (uint)line + 1) {
        in_RSI = (sector_t_conflict *)(ulong)(uint)line;
        piVar5 = TArray<int,_int>::operator[]((TArray<int,_int> *)local_28,(size_t)in_RSI);
        itr_1 = (FSectorTagIterator)(plVar1 + *piVar5);
        if ((*(int *)((long)itr_1 + 0x2c) == *(int *)(copyscrollers._8_8_ + 0x2c)) &&
           ((*(int *)((long)itr_1 + 0x30) & 1U) != 0)) {
          pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
          in_RSI = (sector_t_conflict *)0x2;
          DScroller::DScroller
                    (pDVar6,sc_ceiling,-dy,_accel,special,
                     (int)((ulong)(*(long *)((long)itr_1 + 0x78) - (long)sectors) >> 3) * 0x7a44c6b,
                     local_50,scw_all);
        }
      }
    }
    else if (spec._4_4_ == 0xe1) {
      itr.searchtag =
           (int)((ulong)((long)lines[(int)l._4_4_].sidedef[0] - (long)sides) >> 6) * -0x55555555;
      pDVar6 = (DScroller *)DObject::operator_new((DObject *)0x90,(size_t)in_RSI);
      dVar7 = side_t::GetTextureXOffset(sides + itr.searchtag,1);
      dy_00 = side_t::GetTextureYOffset(sides + itr.searchtag,1);
      if ((*(int *)(copyscrollers._8_8_ + 0x2c) < 1) ||
         ((*(uint *)(copyscrollers._8_8_ + 0x2c) & 0xfffffff8) != 0)) {
        local_1b4 = scw_all;
      }
      else {
        local_1b4 = *(EScrollPos *)(copyscrollers._8_8_ + 0x2c);
      }
      in_RSI = (sector_t_conflict *)0x0;
      DScroller::DScroller(pDVar6,sc_side,-dVar7,dy_00,-1,itr.searchtag,local_50,local_1b4);
    }
    else {
      *(uint *)(copyscrollers._8_8_ + 0x28) = spec._4_4_;
    }
    copyscrollers._8_8_ = copyscrollers._8_8_ + 0x98;
  }
  TArray<int,_int>::~TArray((TArray<int,_int> *)local_28);
  return;
}

Assistant:

void P_SpawnScrollers(void)
{
	int i;
	line_t *l = lines;
	TArray<int> copyscrollers;

	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Sector_CopyScroller)
		{
			// don't allow copying the scroller if the sector has the same tag as it would just duplicate it.
			if (!tagManager.SectorHasTag(lines[i].frontsector, lines[i].args[0]))
			{
				copyscrollers.Push(i);
			}
			lines[i].special = 0;
		}
	}

	for (i = 0; i < numlines; i++, l++)
	{
		double dx;	// direction and speed of scrolling
		double dy;
		int control = -1, accel = 0;		// no control sector or acceleration
		int special = l->special;

		// Check for undefined parameters that are non-zero and output messages for them.
		// We don't report for specials we don't understand.
		FLineSpecial *spec = P_GetLineSpecialInfo(special);
		if (spec != NULL)
		{
			int max = spec->map_args;
			for (unsigned arg = max; arg < countof(l->args); ++arg)
			{
				if (l->args[arg] != 0)
				{
					Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",
						i, special, spec->name, arg+1, l->args[arg]);
				}
			}
		}

		// killough 3/7/98: Types 245-249 are same as 250-254 except that the
		// first side's sector's heights cause scrolling when they change, and
		// this linedef controls the direction and speed of the scrolling. The
		// most complicated linedef since donuts, but powerful :)
		//
		// killough 3/15/98: Add acceleration. Types 214-218 are the same but
		// are accelerative.

		// [RH] Assume that it's a scroller and zero the line's special.
		l->special = 0;

		dx = dy = 0;	// Shut up, GCC

		if (special == Scroll_Ceiling ||
			special == Scroll_Floor ||
			special == Scroll_Texture_Model)
		{
			if (l->args[1] & 3)
			{
				// if 1, then displacement
				// if 2, then accelerative (also if 3)
				control = int(l->sidedef[0]->sector - sectors);
				if (l->args[1] & 2)
					accel = 1;
			}
			if (special == Scroll_Texture_Model ||
				l->args[1] & 4)
			{
				// The line housing the special controls the
				// direction and speed of scrolling.
				dx = l->Delta().X / 32.;
				dy = l->Delta().Y / 32.;
			}
			else
			{
				// The speed and direction are parameters to the special.
				dx = (l->args[3] - 128) / 32.;
				dy = (l->args[4] - 128) / 32.;
			}
		}

		switch (special)
		{
			int s;

		case Scroll_Ceiling:
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				new DScroller(EScroll::sc_ceiling, -dx, dy, control, s, accel);
			}
			for (unsigned j = 0; j < copyscrollers.Size(); j++)
			{
				line_t *line = &lines[copyscrollers[j]];

				if (line->args[0] == l->args[0] && (line->args[1] & 1))
				{
					new DScroller(EScroll::sc_ceiling, -dx, dy, control, int(line->frontsector - sectors), accel);
				}
			}
			break;
		}

		case Scroll_Floor:
			if (l->args[2] != 1)
			{ // scroll the floor texture
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_floor, -dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 2))
					{
						new DScroller (EScroll::sc_floor, -dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}

			if (l->args[2] > 0)
			{ // carry objects on the floor
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_carry, dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 4))
					{
						new DScroller (EScroll::sc_carry, dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}
			break;

		// killough 3/1/98: scroll wall according to linedef
		// (same direction and speed as scrolling floors)
		case Scroll_Texture_Model:
		{
			FLineIdIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				if (s != i)
					new DScroller(dx, dy, lines + s, control, accel);
			}
			break;
		}

		case Scroll_Texture_Offsets:
			// killough 3/2/98: scroll according to sidedef offsets
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -sides[s].GetTextureXOffset(side_t::mid),
				sides[s].GetTextureYOffset(side_t::mid), -1, s, accel, SCROLLTYPE(l->args[0]));
			break;

		case Scroll_Texture_Left:
			l->special = special;	// Restore the special, for compat_useblocking's benefit.
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Right:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Up:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Down:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, -l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Both:
			s = int(lines[i].sidedef[0] - sides);
			if (l->args[0] == 0) {
				dx = (l->args[1] - l->args[2]) / 64.;
				dy = (l->args[4] - l->args[3]) / 64.;
				new DScroller (EScroll::sc_side, dx, dy, -1, s, accel);
			}
			break;

		default:
			// [RH] It wasn't a scroller after all, so restore the special.
			l->special = special;
			break;
		}
	}
}